

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL>::
prepare_tess_ctrl_shader
          (string *__return_storage_ptr__,
          InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type,string *function_definition,string *function_use,
          string *verification)

{
  TestError *this_00;
  string *verification_local;
  string *function_use_local;
  string *function_definition_local;
  TestShaderType tested_shader_type_local;
  InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  string *tess_ctrl_shader_source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (GEOMETRY_SHADER_TYPE < tested_shader_type) {
    if (tested_shader_type == TESSELATION_CONTROL_SHADER_TYPE) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 "layout(vertices = 1) out;\n\nout float tcs_result[];\n\n");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)function_definition);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)shader_start_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)function_use);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)verification);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 "    tcs_result[gl_InvocationID] = result;\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n    gl_TessLevelOuter[2] = 1.0;\n    gl_TessLevelOuter[3] = 1.0;\n    gl_TessLevelInner[0] = 1.0;\n    gl_TessLevelInner[1] = 1.0;\n}\n"
                );
    }
    else {
      if (tested_shader_type != TESSELATION_EVALUATION_SHADER_TYPE) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Unrecognized shader object type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0x13b7);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)default_tc_shader_source_abi_cxx11_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InteractionFunctionCalls1<API>::prepare_tess_ctrl_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& function_definition,
	const std::string& function_use, const std::string& verification)
{
	std::string tess_ctrl_shader_source;

	switch (tested_shader_type)
	{
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		break;

	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		tess_ctrl_shader_source = "layout(vertices = 1) out;\n"
								  "\n"
								  "out float tcs_result[];\n"
								  "\n";

		/* User-defined function definition. */
		tess_ctrl_shader_source += function_definition;
		tess_ctrl_shader_source += "\n\n";

		/* Main function definition. */
		tess_ctrl_shader_source += shader_start;
		tess_ctrl_shader_source += function_use;
		tess_ctrl_shader_source += "\n\n";
		tess_ctrl_shader_source += verification;
		tess_ctrl_shader_source += "\n\n";
		tess_ctrl_shader_source += "    tcs_result[gl_InvocationID] = result;\n"
								   "\n"
								   "    gl_TessLevelOuter[0] = 1.0;\n"
								   "    gl_TessLevelOuter[1] = 1.0;\n"
								   "    gl_TessLevelOuter[2] = 1.0;\n"
								   "    gl_TessLevelOuter[3] = 1.0;\n"
								   "    gl_TessLevelInner[0] = 1.0;\n"
								   "    gl_TessLevelInner[1] = 1.0;\n"
								   "}\n";
		break;

	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		tess_ctrl_shader_source = default_tc_shader_source;
		break;

	default:
		TCU_FAIL("Unrecognized shader object type.");
		break;
	}

	return tess_ctrl_shader_source;
}